

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937_64.hpp
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,status_type *S)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  long lVar3;
  status_type S_new;
  delim_c local_a03;
  delim_c local_a02;
  delim_c local_a01;
  io_range<unsigned_long_*> local_a00;
  int local_9e8 [2];
  unsigned_long local_9e0 [312];
  
  local_9e8[0] = 0;
  memset(local_9e0,0,0x9c0);
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_a01.c = '(';
  pbVar2 = utility::operator>>(in,&local_a01);
  pbVar2 = (basic_istream<char,_std::char_traits<char>_> *)
           std::istream::operator>>((istream *)pbVar2,local_9e8);
  local_a02.c = ' ';
  pbVar2 = utility::operator>>(pbVar2,&local_a02);
  local_a00.last = (unsigned_long *)&stack0xffffffffffffffe0;
  local_a00.delim_str = " ";
  local_a00.first = local_9e0;
  pbVar2 = utility::operator>>(pbVar2,&local_a00);
  local_a03.c = ')';
  utility::operator>>(pbVar2,&local_a03);
  lVar3 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar3 + 0x20] & 5) == 0) {
    memcpy(S,local_9e8,0x9c8);
    lVar3 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar3 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, status_type &S) {
        status_type S_new;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> S_new.mti >> utility::delim(' ') >>
            utility::make_io_range(S_new.mt, S_new.mt + N, " ") >> utility::delim(')');
        if (in)
          S = S_new;
        in.flags(flags);
        return in;
      }